

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void LexOctal(SQChar *s,SQUnsignedInteger *res)

{
  SQInteger SVar1;
  SQUnsignedInteger *res_local;
  SQChar *s_local;
  
  *res = 0;
  res_local = (SQUnsignedInteger *)s;
  while( true ) {
    if ((char)*res_local == '\0') {
      return;
    }
    SVar1 = scisodigit((long)(char)*res_local);
    if (SVar1 == 0) break;
    *res = *res * 8 + (long)((char)*res_local + -0x30);
    res_local = (SQUnsignedInteger *)((long)res_local + 1);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqlexer.cpp"
                ,0x1d8,"void LexOctal(const SQChar *, SQUnsignedInteger *)");
}

Assistant:

void LexOctal(const SQChar *s,SQUnsignedInteger *res)
{
    *res = 0;
    while(*s != 0)
    {
        if(scisodigit(*s)) *res = (*res)*8+((*s++)-'0');
        else { assert(0); }
    }
}